

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPSHandler.h
# Opt level: O0

void __thiscall
HTTPSHandler<Client>::
handle<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>>
          (HTTPSHandler<Client> *this,Client *client,
          request<boost::beast::http::basic_string_body<char>,_http::basic_fields<allocator<char>_>_>
          *request)

{
  error_code ec_00;
  error_code ec_01;
  error_code ec_02;
  error_code ec_03;
  error_code ec_04;
  bool bVar1;
  ostream *poVar2;
  socket *psVar3;
  int __how;
  error_code local_238;
  undefined1 local_228 [8];
  request<http::string_body> req;
  send_lambda<boost::beast::ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_&>_>
  lambda;
  flat_buffer buffer;
  bool close;
  ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_&>
  local_148;
  ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_&>
  stream;
  exception *e;
  undefined4 local_10c;
  undefined1 local_108 [4];
  int count;
  context ctx;
  undefined1 local_d0 [8];
  string cert_path;
  allocator<char> local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  const_buffer local_70;
  undefined1 auStack_60 [8];
  error_code ec;
  undefined1 local_40 [8];
  string host;
  request<boost::beast::http::basic_string_body<char>,_http::basic_fields<allocator<char>_>_>
  *request_local;
  Client *client_local;
  HTTPSHandler<Client> *this_local;
  
  host.field_2._8_8_ = request;
  parse_host<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>>
            ((string *)local_40,request);
  poVar2 = std::operator<<((ostream *)&std::cout,"Host: ");
  poVar2 = std::operator<<(poVar2,(string *)local_40);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"---------------request----------------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = boost::beast::http::operator<<
                     ((ostream *)&std::cout,
                      (message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
                       *)host.field_2._8_8_);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"--------------------------------------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  boost::system::error_code::error_code((error_code *)auStack_60);
  psVar3 = Client::get_socket(client);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,
             "HTTP/1.0 200 Connection established\r\nProxy-agent: node.js-proxy\r\n\r\n",&local_91);
  local_70 = (const_buffer)
             boost::asio::buffer<char,std::char_traits<char>,std::allocator<char>>(&local_90);
  boost::asio::
  write<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::const_buffers_1>
            (psVar3,(const_buffers_1 *)&local_70,(error_code *)auStack_60,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)auStack_60);
  if (bVar1) {
    ec_04.cat_ = (error_category *)ec._0_8_;
    ec_04.val_ = auStack_60._0_4_;
    ec_04.failed_ = (bool)auStack_60[4];
    ec_04._5_3_ = auStack_60._5_3_;
    fail(ec_04,"init-write");
    cert_path.field_2._12_4_ = 1;
  }
  else {
    std::filesystem::__cxx11::path::string
              ((string *)
               &ctx.init_.ref_.
                super___shared_ptr<boost::asio::ssl::detail::openssl_init_base::do_init,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,&this->main_dirpath);
    generate_cert((string *)local_d0,(string *)local_40,
                  (string *)
                  &ctx.init_.ref_.
                   super___shared_ptr<boost::asio::ssl::detail::openssl_init_base::do_init,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount);
    std::__cxx11::string::~string
              ((string *)
               &ctx.init_.ref_.
                super___shared_ptr<boost::asio::ssl::detail::openssl_init_base::do_init,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    boost::asio::ssl::context::context((context *)local_108,tlsv12);
    local_10c = 1;
    std::filesystem::__cxx11::path::string((string *)&e,&this->main_dirpath);
    load_server_certificate((context *)local_108,(string *)local_d0,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    psVar3 = Client::get_socket(client);
    boost::beast::
    ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>&>
    ::
    ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>&>
              ((ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>&>
                *)&local_148,psVar3,(context *)local_108);
    boost::beast::
    ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_&>
    ::handshake(&local_148,server,(error_code *)auStack_60);
    bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)auStack_60);
    if (bVar1) {
      ec_03.cat_ = (error_category *)ec._0_8_;
      ec_03.val_ = auStack_60._0_4_;
      ec_03.failed_ = (bool)auStack_60[4];
      ec_03._5_3_ = auStack_60._5_3_;
      fail(ec_03,"handshake");
      cert_path.field_2._12_4_ = 1;
    }
    else {
      buffer.max_._7_1_ = 0;
      boost::beast::basic_flat_buffer<std::allocator<char>_>::basic_flat_buffer
                ((basic_flat_buffer<std::allocator<char>_> *)&lambda.ec_);
      send_lambda<boost::beast::ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_&>_>
      ::send_lambda((send_lambda<boost::beast::ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_&>_>
                     *)((long)&req.
                               super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
                               .value_.field_2 + 8),&local_148,(bool *)((long)&buffer.max_ + 7),
                    (error_code *)auStack_60);
      do {
        boost::beast::http::
        message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
        ::message((message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
                   *)local_228);
        boost::beast::http::
        read<boost::beast::ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>&>,boost::beast::basic_flat_buffer<std::allocator<char>>,true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>>
                  (&local_148,(basic_flat_buffer<std::allocator<char>_> *)&lambda.ec_,
                   (message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
                    *)local_228,(error_code *)auStack_60);
        boost::system::error_code::error_code<boost::beast::http::error>
                  (&local_238,end_of_stream,(type *)0x0);
        bVar1 = boost::system::operator==((error_code *)auStack_60,&local_238);
        if (bVar1) {
          cert_path.field_2._12_4_ = 4;
        }
        else {
          bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)auStack_60);
          if (bVar1) {
            ec_02.cat_ = (error_category *)ec._0_8_;
            ec_02.val_ = auStack_60._0_4_;
            ec_02.failed_ = (bool)auStack_60[4];
            ec_02._5_3_ = auStack_60._5_3_;
            fail(ec_02,"read");
            cert_path.field_2._12_4_ = 1;
          }
          else {
            save_request<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>>
                      (this,(request<boost::beast::http::basic_string_body<char>,_http::basic_fields<allocator<char>_>_>
                             *)local_228);
            send_response<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>,send_lambda<boost::beast::ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>&>>&>
                      (this,(request<boost::beast::http::basic_string_body<char>,_http::basic_fields<allocator<char>_>_>
                             *)local_228,
                       (send_lambda<boost::beast::ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_&>_>
                        *)((long)&req.
                                  super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
                                  .value_.field_2 + 8));
            bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)auStack_60);
            if (bVar1) {
              ec_01.cat_ = (error_category *)ec._0_8_;
              ec_01.val_ = auStack_60._0_4_;
              ec_01.failed_ = (bool)auStack_60[4];
              ec_01._5_3_ = auStack_60._5_3_;
              fail(ec_01,"write");
              cert_path.field_2._12_4_ = 1;
            }
            else if ((buffer.max_._7_1_ & 1) == 0) {
              cert_path.field_2._12_4_ = 0;
            }
            else {
              cert_path.field_2._12_4_ = 4;
            }
          }
        }
        boost::beast::http::
        message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
        ::~message((message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
                    *)local_228);
      } while (cert_path.field_2._12_4_ == 0);
      if (cert_path.field_2._12_4_ == 4) {
        boost::beast::
        ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_&>
        ::shutdown(&local_148,(int)auStack_60,__how);
        bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)auStack_60);
        if (bVar1) {
          ec_00.cat_ = (error_category *)ec._0_8_;
          ec_00.val_ = auStack_60._0_4_;
          ec_00.failed_ = (bool)auStack_60[4];
          ec_00._5_3_ = auStack_60._5_3_;
          fail(ec_00,"shutdown");
          cert_path.field_2._12_4_ = 1;
        }
        else {
          cert_path.field_2._12_4_ = 0;
        }
      }
      boost::beast::basic_flat_buffer<std::allocator<char>_>::~basic_flat_buffer
                ((basic_flat_buffer<std::allocator<char>_> *)&lambda.ec_);
    }
    boost::beast::
    ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_&>
    ::~ssl_stream(&local_148);
    boost::asio::ssl::context::~context((context *)local_108);
    std::__cxx11::string::~string((string *)local_d0);
  }
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void HTTPSHandler<T>::handle(T&& client, 
                            const http::request<Body, http::basic_fields<Allocator>>& request) {
    std::string host = parse_host(request);

    std::cout << "Host: " << host << std::endl;

    std::cout << "---------------request----------------" << std::endl;
    std::cout << request << std::endl;
    std::cout << "--------------------------------------" << std::endl;

    beast::error_code ec;
    boost::asio::write(
        client.get_socket(), 
        boost::asio::buffer(
            std::string(
                "HTTP/1.0 200 Connection established\r\n"
                "Proxy-agent: node.js-proxy\r\n\r\n"
            )
        ), 
        ec
    );

    if(ec) {
        return fail(ec, "init-write");
    }

    // Generate for each socket individual certificate
    std::string cert_path = generate_cert(host, main_dirpath.string());
    ssl::context ctx{ssl::context::tlsv12};

    int count = 0;
    while (true) {  // We need this to wait cert generate
        try {
            count++;
            load_server_certificate(
                ctx, 
                cert_path,
                main_dirpath.string()
            );
            break;
        } catch (std::exception& e) {
            if (count > CERT_GENERATE_LOAD_LIMIT) {
                std::cerr << "Exception: Certificate load limit" << std::endl;
                throw e;
            }
            std::cerr << "Exception: " << e.what() << std::endl;
            std::this_thread::sleep_for(100ms);
        }
    }

    beast::ssl_stream<tcp::socket&> stream{client.get_socket(), ctx};
    stream.handshake(ssl::stream_base::server, ec);
    if (ec) {
        return fail(ec, "handshake");
    }

    bool close = false;
    beast::flat_buffer buffer;
    send_lambda<beast::ssl_stream<tcp::socket&>> lambda{stream, close, ec};
    for(;;) {
            
        http::request<http::string_body> req;
        http::read(stream, buffer, req, ec);

        if (ec == http::error::end_of_stream) {
            break;
        }
        if (ec) {
            return fail(ec, "read");
        } 

        save_request(req);
        send_response(std::move(req), lambda);

        if (ec) {
            return fail(ec, "write");
        }
        if (close) {
            break;
        }

    }

    stream.shutdown(ec);
    if (ec) {
        return fail(ec, "shutdown");
    }
}